

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O0

FT_Pos af_cjk_compute_stem_width
                 (AF_GlyphHints hints,AF_Dimension dim,FT_Pos width,FT_UInt base_flags,
                 FT_UInt stem_flags)

{
  AF_StyleMetrics_conflict pAVar1;
  ulong uVar2;
  FT_Pos FVar3;
  long lVar4;
  bool bVar5;
  long local_60;
  FT_Pos delta;
  FT_Bool vertical;
  ulong uStack_48;
  FT_Int sign;
  FT_Pos dist;
  AF_CJKAxis axis;
  AF_CJKMetrics metrics;
  FT_UInt stem_flags_local;
  FT_UInt base_flags_local;
  FT_Pos width_local;
  AF_Dimension dim_local;
  AF_GlyphHints hints_local;
  
  pAVar1 = hints->metrics;
  lVar4 = (ulong)dim * 0x3838;
  bVar5 = dim == AF_DIMENSION_VERT;
  if ((hints->other_flags & 4) == 0) {
    return width;
  }
  uStack_48 = width;
  if (width < 0) {
    uStack_48 = -width;
  }
  if (((bVar5) && ((hints->other_flags & 2) == 0)) || ((!bVar5 && ((hints->other_flags & 1) == 0))))
  {
    if (*(int *)((long)pAVar1 + lVar4 + 0x60) != 0) {
      if ((long)(uStack_48 - *(long *)((long)pAVar1 + lVar4 + 0x70)) < 0) {
        local_60 = -(uStack_48 - *(long *)((long)pAVar1 + lVar4 + 0x70));
      }
      else {
        local_60 = uStack_48 - *(long *)((long)pAVar1 + lVar4 + 0x70);
      }
      if (local_60 < 0x28) {
        uStack_48 = *(ulong *)((long)pAVar1 + lVar4 + 0x70);
        if ((long)uStack_48 < 0x30) {
          uStack_48 = 0x30;
        }
        goto LAB_001ca991;
      }
    }
    if ((long)uStack_48 < 0x36) {
      uStack_48 = uStack_48 + (long)(0x36 - uStack_48) / 2;
    }
    else if ((long)uStack_48 < 0xc0) {
      uVar2 = uStack_48 & 0x3f;
      uStack_48 = uStack_48 & 0xffffffffffffffc0;
      if (uVar2 < 10) {
        uStack_48 = uVar2 + uStack_48;
      }
      else if (uVar2 < 0x16) {
        uStack_48 = uStack_48 + 10;
      }
      else if (uVar2 < 0x2a) {
        uStack_48 = uVar2 + uStack_48;
      }
      else if (uVar2 < 0x36) {
        uStack_48 = uStack_48 + 0x36;
      }
      else {
        uStack_48 = uVar2 + uStack_48;
      }
    }
  }
  else {
    FVar3 = af_cjk_snap_width((AF_Width)((long)pAVar1 + lVar4 + 0x68),
                              *(FT_UInt *)((long)pAVar1 + lVar4 + 0x60),uStack_48);
    if (bVar5) {
      if (FVar3 < 0x40) {
        uStack_48 = 0x40;
      }
      else {
        uStack_48 = FVar3 + 0x10U & 0xffffffffffffffc0;
      }
    }
    else if ((hints->other_flags & 8) == 0) {
      if (FVar3 < 0x30) {
        uStack_48 = FVar3 + 0x40 >> 1;
      }
      else {
        if (FVar3 < 0x80) {
          uStack_48 = FVar3 + 0x16;
        }
        else {
          uStack_48 = FVar3 + 0x20;
        }
        uStack_48 = uStack_48 & 0xffffffffffffffc0;
      }
    }
    else if (FVar3 < 0x40) {
      uStack_48 = 0x40;
    }
    else {
      uStack_48 = FVar3 + 0x20U & 0xffffffffffffffc0;
    }
  }
LAB_001ca991:
  if (width < 0) {
    uStack_48 = -uStack_48;
  }
  return uStack_48;
}

Assistant:

static FT_Pos
  af_cjk_compute_stem_width( AF_GlyphHints  hints,
                             AF_Dimension   dim,
                             FT_Pos         width,
                             FT_UInt        base_flags,
                             FT_UInt        stem_flags )
  {
    AF_CJKMetrics  metrics  = (AF_CJKMetrics)hints->metrics;
    AF_CJKAxis     axis     = &metrics->axis[dim];
    FT_Pos         dist     = width;
    FT_Int         sign     = 0;
    FT_Bool        vertical = FT_BOOL( dim == AF_DIMENSION_VERT );

    FT_UNUSED( base_flags );
    FT_UNUSED( stem_flags );


    if ( !AF_LATIN_HINTS_DO_STEM_ADJUST( hints ) )
      return width;

    if ( dist < 0 )
    {
      dist = -width;
      sign = 1;
    }

    if ( (  vertical && !AF_LATIN_HINTS_DO_VERT_SNAP( hints ) ) ||
         ( !vertical && !AF_LATIN_HINTS_DO_HORZ_SNAP( hints ) ) )
    {
      /* smooth hinting process: very lightly quantize the stem width */

      if ( axis->width_count > 0 )
      {
        if ( FT_ABS( dist - axis->widths[0].cur ) < 40 )
        {
          dist = axis->widths[0].cur;
          if ( dist < 48 )
            dist = 48;

          goto Done_Width;
        }
      }

      if ( dist < 54 )
        dist += ( 54 - dist ) / 2;
      else if ( dist < 3 * 64 )
      {
        FT_Pos  delta;


        delta  = dist & 63;
        dist  &= -64;

        if ( delta < 10 )
          dist += delta;
        else if ( delta < 22 )
          dist += 10;
        else if ( delta < 42 )
          dist += delta;
        else if ( delta < 54 )
          dist += 54;
        else
          dist += delta;
      }
    }
    else
    {
      /* strong hinting process: snap the stem width to integer pixels */

      dist = af_cjk_snap_width( axis->widths, axis->width_count, dist );

      if ( vertical )
      {
        /* in the case of vertical hinting, always round */
        /* the stem heights to integer pixels            */

        if ( dist >= 64 )
          dist = ( dist + 16 ) & ~63;
        else
          dist = 64;
      }
      else
      {
        if ( AF_LATIN_HINTS_DO_MONO( hints ) )
        {
          /* monochrome horizontal hinting: snap widths to integer pixels */
          /* with a different threshold                                   */

          if ( dist < 64 )
            dist = 64;
          else
            dist = ( dist + 32 ) & ~63;
        }
        else
        {
          /* for horizontal anti-aliased hinting, we adopt a more subtle */
          /* approach: we strengthen small stems, round stems whose size */
          /* is between 1 and 2 pixels to an integer, otherwise nothing  */

          if ( dist < 48 )
            dist = ( dist + 64 ) >> 1;

          else if ( dist < 128 )
            dist = ( dist + 22 ) & ~63;
          else
            /* round otherwise to prevent color fringes in LCD mode */
            dist = ( dist + 32 ) & ~63;
        }
      }
    }

  Done_Width:
    if ( sign )
      dist = -dist;

    return dist;
  }